

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

tm * http_gmtime(time_t timer,tm *tm)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  
  *(undefined8 *)&tm->tm_isdst = 0;
  tm->tm_gmtoff = 0;
  tm->tm_mon = 0;
  tm->tm_year = 0;
  tm->tm_wday = 0;
  tm->tm_yday = 0;
  tm->tm_sec = 0;
  tm->tm_min = 0;
  tm->tm_hour = 0;
  tm->tm_mday = 0;
  tm->tm_zone = (char *)0x0;
  if (timer < 0) {
    uVar8 = (ulong)-timer / 0x3c;
    iVar16 = ((int)timer - (int)(uVar8 * -0x3c)) + 0x3c;
    uVar7 = ~uVar8;
    if (timer == uVar8 * -0x3c) {
      iVar16 = 0;
      uVar7 = -uVar8;
    }
    tm->tm_sec = iVar16;
    uVar9 = -uVar7 / 0x3c;
    iVar16 = ((int)uVar7 - (int)(uVar9 * -0x3c)) + 0x3c;
    uVar8 = ~uVar9;
    if (uVar7 == uVar9 * -0x3c) {
      iVar16 = 0;
      uVar8 = -uVar9;
    }
    tm->tm_min = iVar16;
    uVar9 = -uVar8 / 0x18;
    uVar7 = ~uVar9;
    iVar16 = ((int)uVar8 - (int)(uVar9 * -0x18)) + 0x18;
    if (uVar8 == uVar9 * -0x18) {
      uVar7 = -uVar9;
      iVar16 = 0;
    }
    tm->tm_hour = iVar16;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = 3 - uVar7;
    uVar12 = SUB164(auVar5 % ZEXT816(7),0);
    tm->tm_wday = -uVar12;
    if (SUB168(auVar5 % ZEXT816(7),0) == 0) goto LAB_0012188e;
    uVar12 = uVar12 ^ 7;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = timer;
    iVar16 = SUB164(auVar1 / ZEXT816(0x3c),0);
    tm->tm_sec = iVar16 * -0x3c + (int)timer;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = timer;
    iVar6 = SUB164(auVar2 / ZEXT816(0xe10),0);
    tm->tm_min = iVar6 * -0x3c + iVar16;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = timer;
    uVar7 = SUB168(auVar3 / ZEXT816(0x15180),0);
    tm->tm_hour = SUB164(auVar3 / ZEXT816(0x15180),0) * -0x18 + iVar6;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar7 + 4;
    uVar12 = SUB164(auVar4 % ZEXT816(7),0);
  }
  tm->tm_wday = uVar12;
LAB_0012188e:
  lVar10 = uVar7 + 0x8bfbc;
  if (-0xafa6d < (long)uVar7) {
    lVar10 = uVar7 + 0xafa6c;
  }
  uVar11 = (int)(uVar7 + 0xafa6c) + (int)(lVar10 / 0x23ab1) * -0x23ab1;
  uVar15 = 0;
  uVar7 = (ulong)((uVar11 / 0x8eac + uVar11) - (uVar11 / 0x23ab0 + uVar11 / 0x5b4)) / 0x16d;
  uVar12 = (uint)uVar7;
  uVar13 = uVar12 & 0xffff;
  uVar17 = ((uVar12 * -0x16d + uVar11) - (uVar13 >> 2)) + (ushort)uVar7 / 100;
  uVar14 = uVar17 & 0xffff;
  uVar11 = (uVar14 * 5 + 2) / 0x99;
  uVar12 = uVar11 + 2;
  if (0x131 < uVar14) {
    uVar12 = uVar11 + 0xf6;
  }
  uVar7 = (lVar10 / 0x23ab1) * 400 + (ulong)uVar13 + (ulong)((uVar12 & 0xff) < 2);
  tm->tm_year = (int)uVar7 + -0x76c;
  tm->tm_mon = uVar12 & 0xff;
  tm->tm_mday = (uVar17 - (uVar11 * 0x99 + 2) / 5) + 1 & 0xffff;
  if ((uVar7 & 3) == 0) {
    if ((long)uVar7 % 100 == 0) {
      uVar15 = (uint)((long)uVar7 % 400 == 0);
    }
    else {
      uVar15 = 1;
    }
  }
  tm->tm_yday = (uVar14 + uVar15 + 0x3b) % (uVar15 + 0x16d);
  return tm;
}

Assistant:

struct tm *http_gmtime(time_t timer, struct tm *tm) {
  ssize_t a, b;
#if HAVE_TM_TM_ZONE || defined(BSD)
  *tm = (struct tm){
      .tm_isdst = 0,
      .tm_zone = (char *)"UTC",
  };
#else
  *tm = (struct tm){
      .tm_isdst = 0,
  };
#endif

  // convert seconds from epoch to days from epoch + extract data
  if (timer >= 0) {
    // for seconds up to weekdays, we reduce the reminder every step.
    a = (ssize_t)timer;
    b = a / 60; // b == time in minutes
    tm->tm_sec = a - (b * 60);
    a = b / 60; // b == time in hours
    tm->tm_min = b - (a * 60);
    b = a / 24; // b == time in days since epoch
    tm->tm_hour = a - (b * 24);
    // b == number of days since epoch
    // day of epoch was a thursday. Add + 4 so sunday == 0...
    tm->tm_wday = (b + 4) % 7;
  } else {
    // for seconds up to weekdays, we reduce the reminder every step.
    a = (ssize_t)timer;
    b = a / 60; // b == time in minutes
    if (b * 60 != a) {
      /* seconds passed */
      tm->tm_sec = (a - (b * 60)) + 60;
      --b;
    } else {
      /* no seconds */
      tm->tm_sec = 0;
    }
    a = b / 60; // b == time in hours
    if (a * 60 != b) {
      /* minutes passed */
      tm->tm_min = (b - (a * 60)) + 60;
      --a;
    } else {
      /* no minutes */
      tm->tm_min = 0;
    }
    b = a / 24; // b == time in days since epoch?
    if (b * 24 != a) {
      /* hours passed */
      tm->tm_hour = (a - (b * 24)) + 24;
      --b;
    } else {
      /* no hours */
      tm->tm_hour = 0;
    }
    // day of epoch was a thursday. Add + 4 so sunday == 0...
    tm->tm_wday = ((b - 3) % 7);
    if (tm->tm_wday)
      tm->tm_wday += 7;
    /* b == days from epoch */
  }

  // at this point we can apply the algorithm described here:
  // http://howardhinnant.github.io/date_algorithms.html#civil_from_days
  // Credit to Howard Hinnant.
  {
    b += 719468L; // adjust to March 1st, 2000 (post leap of 400 year era)
    // 146,097 = days in era (400 years)
    const size_t era = (b >= 0 ? b : b - 146096) / 146097;
    const uint32_t doe = (b - (era * 146097)); // day of era
    const uint16_t yoe =
        (doe - doe / 1460 + doe / 36524 - doe / 146096) / 365; // year of era
    a = yoe;
    a += era * 400; // a == year number, assuming year starts on March 1st...
    const uint16_t doy = doe - (365 * yoe + yoe / 4 - yoe / 100);
    const uint16_t mp = (5U * doy + 2) / 153;
    const uint16_t d = doy - (153U * mp + 2) / 5 + 1;
    const uint8_t m = mp + (mp < 10 ? 2 : -10);
    a += (m <= 1);
    tm->tm_year = a - 1900; // tm_year == years since 1900
    tm->tm_mon = m;
    tm->tm_mday = d;
    const uint8_t is_leap = (a % 4 == 0 && (a % 100 != 0 || a % 400 == 0));
    tm->tm_yday = (doy + (is_leap) + 28 + 31) % (365 + is_leap);
  }

  return tm;
}